

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::AsyncIoStreamWithGuards::write(AsyncIoStreamWithGuards *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  uchar *puVar1;
  anon_class_24_2_36b6643b_for_func aStack_48;
  size_t local_30;
  
  puVar1 = (uchar *)CONCAT44(in_register_00000034,__fd);
  if (puVar1[0x49] == '\x01') {
    (*(code *)**(undefined8 **)(*(long *)(puVar1 + 0x20) + 8))
              (this,*(long *)(puVar1 + 0x20) + 8,__buf,__n);
  }
  else {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&aStack_48);
    aStack_48.buffer.ptr = puVar1;
    aStack_48.buffer.size_ = (size_t)__buf;
    local_30 = __n;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::write(kj::ArrayPtr<unsigned_char_const>)::_lambda()_1_>
              ((Promise<void> *)this,&aStack_48);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&aStack_48);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (writeGuardReleased) {
      return inner->write(buffer);
    } else {
      return writeGuard.addBranch().then([this,buffer]() {
        return inner->write(buffer);
      });
    }
  }